

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Symbol(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this,Static_String *t_s,bool t_disallow_prevention)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  byte local_a9;
  Position local_a0;
  string_view local_80;
  string_view local_70;
  byte local_59;
  undefined1 auStack_58 [7];
  bool retval;
  Position start;
  Depth_Counter local_28;
  Depth_Counter dc;
  bool t_disallow_prevention_local;
  Static_String *t_s_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser._7_1_ = t_disallow_prevention;
  Depth_Counter::Depth_Counter(&local_28,this);
  SkipWS(this,false);
  auStack_58._0_4_ = (this->m_position).line;
  unique0x00012004 = (this->m_position).col;
  start._0_8_ = (this->m_position).m_pos;
  start.m_pos = (this->m_position).m_end;
  start.m_end = *(char **)&(this->m_position).m_last_col;
  local_59 = Symbol_(this,t_s);
  if ((((bool)local_59) && (bVar2 = Position::has_more(&this->m_position), bVar2)) &&
     ((dc.parser._7_1_ & 1) == 0)) {
    pcVar3 = Position::operator*(&this->m_position);
    bVar2 = char_in_alphabet(this,*pcVar3,symbol_alphabet);
    if (bVar2) {
      pcVar3 = Position::operator*(&this->m_position);
      local_a9 = 0;
      if (*pcVar3 != '=') {
        local_70 = Position::str((Position *)auStack_58,&this->m_position);
        bVar2 = is_operator(this,local_70);
        local_a9 = 0;
        if (bVar2) {
          Position::operator+(&local_a0,&this->m_position,1);
          local_80 = Position::str((Position *)auStack_58,&local_a0);
          bVar2 = is_operator(this,local_80);
          local_a9 = bVar2 ^ 0xff;
        }
      }
      if ((local_a9 & 1) == 0) {
        (this->m_position).line = auStack_58._0_4_;
        (this->m_position).col = stack0xffffffffffffffac;
        (this->m_position).m_pos = (char *)start._0_8_;
        (this->m_position).m_end = start.m_pos;
        (this->m_position).m_last_col = (int)start.m_end;
        local_59 = 0;
      }
    }
  }
  bVar1 = local_59;
  Depth_Counter::~Depth_Counter(&local_28);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Symbol(const utility::Static_String &t_s, const bool t_disallow_prevention = false) {
        Depth_Counter dc{this};
        SkipWS();
        const auto start = m_position;
        bool retval = Symbol_(t_s);

        // ignore substring matches
        if (retval && m_position.has_more() && (t_disallow_prevention == false) && char_in_alphabet(*m_position, detail::symbol_alphabet)) {
          if (*m_position != '=' && is_operator(Position::str(start, m_position)) && !is_operator(Position::str(start, m_position + 1))) {
            // don't throw this away, it's a good match and the next is not
          } else {
            m_position = start;
            retval = false;
          }
        }

        return retval;
      }